

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::compare(bigint *lhs,bigint *rhs)

{
  bool bVar1;
  int iVar2;
  bigit bVar3;
  bigit bVar4;
  uint uVar5;
  int iVar6;
  int index;
  int index_00;
  
  index = (int)(lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = lhs->exp_ + index;
  index_00 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar6 = rhs->exp_ + index_00;
  if (iVar2 == iVar6) {
    iVar2 = 0;
    if (0 < index - index_00) {
      iVar2 = index - index_00;
    }
    do {
      if (index <= iVar2) {
        if (index_00 == index) {
          return 0;
        }
        bVar1 = index_00 < index;
        goto LAB_00227d7a;
      }
      index = index + -1;
      index_00 = index_00 + -1;
      bVar3 = bigint::operator[](lhs,index);
      bVar4 = bigint::operator[](rhs,index_00);
    } while (bVar3 == bVar4);
    uVar5 = (bVar4 < bVar3) - 1 | 1;
  }
  else {
    bVar1 = iVar6 < iVar2;
LAB_00227d7a:
    uVar5 = (uint)bVar1 * 2 - 1;
  }
  return uVar5;
}

Assistant:

int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }